

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

bool __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::erase(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        *this,pair<unsigned_long_long,_int> *key)

{
  int iVar1;
  uint uVar2;
  _func_int *p_Var3;
  undefined1 *puVar4;
  bool bVar5;
  int iVar6;
  locType *plVar7;
  undefined4 extraout_var;
  _func_int **pp_Var9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar10;
  node *pnVar11;
  undefined8 *puVar12;
  uint uVar13;
  long lVar14;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar15;
  locType *plVar16;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *pDVar17;
  long lVar18;
  undefined8 *puVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  node **ppnVar23;
  ulong uVar24;
  long lVar25;
  int *pp;
  long lStack_80;
  locType lStack_78;
  int aiStack_70 [4];
  locType *local_60;
  locType *local_58;
  locType *local_50;
  int *local_48;
  node **local_40;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_38;
  node *pnVar8;
  
  iVar6 = this->depth;
  uVar21 = (ulong)iVar6;
  if (uVar21 != 0) {
    uVar22 = uVar21 * 8 + 8;
    if (iVar6 < -1) {
      uVar22 = 0xffffffffffffffff;
    }
    uVar24 = uVar21 * 4 + 4;
    if (iVar6 < -1) {
      uVar24 = 0xffffffffffffffff;
    }
    lStack_80 = 0x10d46a;
    local_38 = this;
    plVar7 = (locType *)operator_new__(uVar22);
    *plVar7 = 0;
    lStack_80 = 0x10d479;
    local_40 = (node **)operator_new__(uVar22);
    lStack_80 = 0x10d485;
    local_48 = (int *)operator_new__(uVar24);
    local_50 = &local_38->root;
    *plVar7 = local_38->root;
    local_58 = plVar7;
    for (lVar14 = 0; plVar7 = local_58, lVar14 < (int)uVar21; lVar14 = lVar14 + 1) {
      local_60 = local_58 + lVar14;
      lStack_80 = 0x10d4c1;
      iVar6 = (*(local_38->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[2])();
      ppnVar23 = local_40;
      pnVar8 = (node *)CONCAT44(extraout_var,iVar6);
      local_40[lVar14] = pnVar8;
      lVar20 = 0x328;
      for (uVar24 = 0; (long)uVar24 < (long)pnVar8->sz; uVar24 = uVar24 + 1) {
        lStack_80 = 0x10d4ec;
        bVar5 = std::operator<((pair<unsigned_long_long,_int> *)((long)&pnVar8->field_0 + lVar20),
                               key);
        if (!bVar5) break;
        pnVar8 = ppnVar23[lVar14];
        lVar20 = lVar20 + 0x10;
      }
      ppnVar23 = local_40;
      uVar21 = (ulong)local_38->depth;
      if (lVar14 < (long)(uVar21 - 1)) {
        pnVar8 = local_40[lVar14];
        if ((int)uVar24 < pnVar8->sz) {
          lStack_80 = 0x10d52e;
          bVar5 = std::operator<(key,(pair<unsigned_long_long,_int> *)
                                     ((long)&pnVar8->field_0 + lVar20));
          uVar24 = (ulong)((int)uVar24 + (uint)!bVar5);
          pnVar8 = ppnVar23[lVar14];
          uVar21 = (ulong)(uint)local_38->depth;
        }
        local_60[1] = (pnVar8->field_0).val[(int)uVar24];
      }
      local_48[lVar14] = (int)uVar24;
    }
    iVar6 = (int)uVar24;
    if (iVar6 != local_40[(long)(int)uVar21 + -1]->sz) {
      lVar14 = (long)iVar6;
      lStack_80 = 0x10d599;
      bVar5 = std::operator<(key,local_40[(long)(int)uVar21 + -1]->keyvalue + lVar14);
      pp = local_48;
      if (!bVar5) {
        iVar1 = local_38->depth;
        if (iVar6 == 0) {
          for (uVar13 = iVar1 - 2; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
            lVar20 = (long)local_48[uVar13];
            if (lVar20 != 0) {
              pnVar8 = local_40[(long)iVar1 + -1];
              uVar21 = pnVar8->keyvalue[0].first;
              pnVar11 = local_40[uVar13];
              uVar22 = pnVar11->keyvalue[lVar20 + -1].first;
              if (((uVar22 <= uVar21) && (uVar21 <= uVar22)) &&
                 (pnVar11->keyvalue[lVar20 + -1].second == pnVar8->keyvalue[0].second)) {
                pnVar11->keyvalue[lVar20 + -1].first = pnVar8->keyvalue[1].first;
                pnVar11->keyvalue[lVar20 + -1].second = pnVar8->keyvalue[1].second;
                lStack_80 = 0x10da9d;
                (*(local_38->file->
                  super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                  )._vptr_FileManager_Base[3])(local_38->file,plVar7 + uVar13);
                break;
              }
            }
          }
        }
        pBVar15 = local_38;
        ppnVar23 = local_40;
        lVar20 = lVar14 * 0x10 + 0x340;
        while( true ) {
          pnVar8 = local_40[(long)iVar1 + -1];
          iVar6 = pnVar8->sz;
          if ((long)iVar6 <= lVar14 + 1) break;
          *(undefined8 *)((long)pnVar8 + lVar20 + -0x18) =
               *(undefined8 *)((long)pnVar8 + lVar20 + -8);
          *(undefined4 *)((long)pnVar8 + lVar20 + -0x10) =
               *(undefined4 *)((long)&pnVar8->field_0 + lVar20);
          *(undefined8 *)((long)&pnVar8->field_0 + lVar14 * 8) =
               *(undefined8 *)((long)&pnVar8->field_0 + lVar14 * 8 + 8);
          lVar20 = lVar20 + 0x10;
          lVar14 = lVar14 + 1;
        }
        pnVar8->sz = iVar6 + -1;
        lVar14 = (long)local_38->depth;
        if (lVar14 == 1) {
          if (iVar6 + -1 == 0) {
            local_38->depth = 0;
            lStack_80 = 0x10d73e;
            DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            ::release(local_38->file,local_38->root);
            pBVar15->root = -1;
            plVar16 = &lStack_78;
            goto LAB_0010dad6;
          }
          pDVar17 = local_38->file;
          pp_Var9 = (pDVar17->
                    super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                    )._vptr_FileManager_Base;
          plVar16 = local_50;
        }
        else {
          if (iVar6 < 0x33) {
            iVar6 = pp[lVar14 + -2];
            pnVar8 = local_40[lVar14 + -2];
            if (iVar6 == pnVar8->sz) {
              local_40[lVar14] = local_40[lVar14 + -1];
              pp[lVar14] = iVar6;
              plVar7[lVar14] = plVar7[lVar14 + -1];
              iVar6 = pnVar8->sz;
              pp[lVar14 + -2] = iVar6 + -1;
              plVar7[lVar14 + -1] = *(locType *)((long)pnVar8 + (long)iVar6 * 8 + -8);
              lStack_80 = 0x10d718;
              iVar6 = (*(local_38->file->
                        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                        )._vptr_FileManager_Base[2])(local_38->file,plVar7 + lVar14 + -1);
              lVar14 = (long)local_38->depth;
              ppnVar23[lVar14 + -1] = (node *)CONCAT44(extraout_var_00,iVar6);
              pnVar8 = ppnVar23[lVar14];
            }
            else {
              pp[lVar14] = iVar6 + 1;
              plVar7[lVar14] = *(locType *)((long)&pnVar8->field_0 + (long)iVar6 * 8 + 8);
              lStack_80 = 0x10d76a;
              iVar6 = (*(local_38->file->
                        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                        )._vptr_FileManager_Base[2])(local_38->file,plVar7 + lVar14);
              pnVar8 = (node *)CONCAT44(extraout_var_01,iVar6);
              lVar14 = (long)local_38->depth;
              ppnVar23[lVar14] = pnVar8;
            }
            pBVar15 = local_38;
            pnVar11 = ppnVar23[(long)iVar1 + -1];
            uVar21 = (ulong)(uint)pnVar11->sz;
            iVar6 = pnVar8->sz;
            uVar13 = iVar6 + pnVar11->sz;
            if ((int)uVar13 < 100) {
              lVar20 = 0x66;
              for (lVar18 = 0; lVar18 < iVar6; lVar18 = lVar18 + 1) {
                (pnVar11->field_0).val[(int)uVar21 + (int)lVar18] = (pnVar8->field_0).val[lVar18];
                pnVar8 = ppnVar23[lVar14];
                pnVar11 = ppnVar23[(long)iVar1 + -1];
                uVar21 = (ulong)pnVar11->sz;
                pnVar11->keyvalue[uVar21 + lVar18].first =
                     *(unsigned_long_long *)((long)pnVar8 + lVar20 * 8 + -8);
                pnVar11->keyvalue[uVar21 + lVar18].second =
                     *(int *)((long)&pnVar8->field_0 + lVar20 * 8);
                iVar6 = pnVar8->sz;
                lVar20 = lVar20 + 2;
              }
              pnVar11->nxt = pnVar8->nxt;
              pnVar11->sz = (int)uVar21 + iVar6;
              lStack_80 = 0x10d8d3;
              (*(local_38->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[3])(local_38->file,plVar7 + (long)local_38->depth + -1);
              lStack_80 = 0x10d8e3;
              DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
              ::release(pBVar15->file,plVar7[pBVar15->depth]);
              aiStack_70[1] = pBVar15->depth + -2;
              lStack_80 = 0x10d8ff;
              erasenonleaf(pBVar15,aiStack_70 + 1,ppnVar23,pp,plVar7);
              plVar16 = &lStack_78;
            }
            else {
              local_60 = &lStack_78;
              aiStack_70[3] = uVar13 + 1;
              uVar21 = (ulong)uVar13;
              puVar10 = (undefined8 *)((long)&lStack_78 - (uVar21 * 8 + 0x17 & 0xfffffffffffffff0));
              puVar12 = puVar10 + uVar21 * -2;
              puVar19 = puVar12;
              do {
                *puVar19 = 0;
                *(undefined4 *)(puVar19 + 1) = 0;
                puVar19 = puVar19 + 2;
              } while (puVar19 != puVar10);
              pnVar8 = ppnVar23[lVar14];
              local_50 = (locType *)pnVar8->keyvalue[0].first;
              aiStack_70[2] = pnVar8->keyvalue[0].second;
              pnVar11 = ppnVar23[(long)iVar1 + -1];
              uVar2 = pnVar11->sz;
              lVar20 = (long)(int)uVar2;
              lVar18 = 0;
              uVar22 = 0;
              if (0 < (int)uVar2) {
                uVar22 = (ulong)uVar2;
              }
              for (; uVar22 * 8 != lVar18; lVar18 = lVar18 + 8) {
                *(undefined8 *)((long)puVar10 + lVar18) =
                     *(undefined8 *)((long)&pnVar11->field_0 + lVar18);
                *(undefined8 *)((long)puVar12 + lVar18 * 2) =
                     *(undefined8 *)((long)&pnVar11->keyvalue[0].first + lVar18 * 2);
                *(undefined4 *)((long)puVar12 + lVar18 * 2 + 8) =
                     *(undefined4 *)((long)&pnVar11->keyvalue[0].second + lVar18 * 2);
              }
              lVar25 = 0;
              for (lVar18 = lVar20; pBVar15 = local_38, ppnVar23 = local_40, pp = local_48,
                  lVar18 < (long)uVar21; lVar18 = lVar18 + 1) {
                *(undefined8 *)((long)puVar10 + lVar25 + lVar20 * 8) =
                     *(undefined8 *)((long)&pnVar8->field_0 + lVar25);
                *(undefined8 *)((long)puVar12 + lVar25 * 2 + lVar20 * 0x10) =
                     *(undefined8 *)((long)&pnVar8->keyvalue[0].first + lVar25 * 2);
                *(undefined4 *)((long)puVar12 + lVar25 * 2 + lVar20 * 0x10 + 8) =
                     *(undefined4 *)((long)&pnVar8->keyvalue[0].second + lVar25 * 2);
                lVar25 = lVar25 + 8;
              }
              pnVar11->sz = (uint)aiStack_70[3] >> 1;
              pnVar8->sz = uVar13 - ((uint)aiStack_70[3] >> 1);
              lVar20 = 0;
              for (lVar18 = 0; lVar25 = (long)pnVar11->sz, lVar18 < lVar25; lVar18 = lVar18 + 1) {
                (pnVar11->field_0).val[lVar18] = puVar10[lVar18];
                pnVar11 = local_40[(long)iVar1 + -1];
                *(undefined8 *)((long)&pnVar11->keyvalue[0].first + lVar20) =
                     *(undefined8 *)((long)puVar12 + lVar20);
                *(undefined4 *)((long)&pnVar11->keyvalue[0].second + lVar20) =
                     *(undefined4 *)((long)puVar12 + lVar20 + 8);
                lVar20 = lVar20 + 0x10;
              }
              pnVar8 = local_40[lVar14];
              puVar12[-1] = 0x66;
              lVar20 = puVar12[-1];
              for (lVar18 = 0; lVar18 < pnVar8->sz; lVar18 = lVar18 + 1) {
                (pnVar8->field_0).val[lVar18] = puVar10[(int)lVar25 + (int)lVar18];
                lVar25 = (long)ppnVar23[(long)iVar1 + -1]->sz;
                pnVar8 = ppnVar23[lVar14];
                *(undefined8 *)((long)pnVar8 + lVar20 * 8 + -8) = puVar12[(lVar25 + lVar18) * 2];
                *(undefined4 *)((long)&pnVar8->field_0 + lVar20 * 8) =
                     *(undefined4 *)(puVar12 + (lVar25 + lVar18) * 2 + 1);
                lVar20 = lVar20 + 2;
              }
              pDVar17 = pBVar15->file;
              iVar6 = pBVar15->depth;
              p_Var3 = (pDVar17->
                       super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                       )._vptr_FileManager_Base[3];
              puVar12[-1] = 0x10da18;
              (*p_Var3)(pDVar17,plVar7 + (long)iVar6 + -1);
              pDVar17 = local_38->file;
              iVar6 = local_38->depth;
              p_Var3 = (pDVar17->
                       super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                       )._vptr_FileManager_Base[3];
              puVar12[-1] = 0x10da31;
              (*p_Var3)(pDVar17,plVar7 + iVar6);
              for (uVar13 = local_38->depth - 2; pBVar15 = local_38, plVar16 = local_60,
                  -1 < (int)uVar13; uVar13 = uVar13 - 1) {
                pnVar8 = ppnVar23[uVar13];
                iVar6 = pp[uVar13];
                puVar4 = (undefined1 *)pnVar8->keyvalue[iVar6].first;
                if (((puVar4 <= local_50) && (local_50 <= puVar4)) &&
                   (pnVar8->keyvalue[iVar6].second == aiStack_70[2])) {
                  pnVar11 = ppnVar23[lVar14];
                  pnVar8->keyvalue[iVar6].first = pnVar11->keyvalue[0].first;
                  pnVar8->keyvalue[iVar6].second = pnVar11->keyvalue[0].second;
                  pDVar17 = local_38->file;
                  p_Var3 = (pDVar17->
                           super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                           )._vptr_FileManager_Base[3];
                  puVar12[-1] = 0x10dacb;
                  (*p_Var3)(pDVar17,plVar7 + uVar13);
                  pBVar15 = local_38;
                  plVar16 = local_60;
                  break;
                }
              }
            }
            goto LAB_0010dad6;
          }
          pDVar17 = local_38->file;
          plVar16 = plVar7 + lVar14 + -1;
          pp_Var9 = (pDVar17->
                    super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                    )._vptr_FileManager_Base;
        }
        lStack_80 = 0x10d664;
        (*pp_Var9[3])(pDVar17,plVar16);
        plVar16 = &lStack_78;
LAB_0010dad6:
        plVar16[-1] = 0x10dade;
        operator_delete__(ppnVar23);
        plVar16[-1] = 0x10dae6;
        operator_delete__(pp);
        plVar16[-1] = 0x10daee;
        operator_delete__(plVar7);
        pBVar15->siz = pBVar15->siz + -1;
        return true;
      }
    }
    lStack_80 = 0x10d5aa;
    operator_delete__(local_40);
    lStack_80 = 0x10d5b3;
    operator_delete__(local_48);
    lStack_80 = 0x10d5bb;
    operator_delete__(plVar7);
  }
  return false;
}

Assistant:

bool erase(const Key &key) {
            if (!depth)return 0;
            int i, j;
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth + 1];
            memset(pos, 0, sizeof pos);
            p = new node *[depth + 1];
            pp = new int[depth + 1];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(key, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j == p[depth - 1]->sz || Compare()(key, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = x->keyvalue[1];
                        file->save(pos[i]);
                        break;
                    }
            }
            //file->release(x->pointer[j]);
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->val[i - 1] = x->val[i];
            --x->sz;
            if (depth == 1) {
                if (!x->sz) {
                    depth = 0;
                    file->release(root);
                    root = -1;
                } else {
                    file->save(root);
                }
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (x->sz >= degree >> 1) {
                file->save(pos[depth - 1]);
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (pp[depth - 2] == p[depth - 2]->sz) {
                p[depth] = p[depth - 1];
                pp[depth] = pp[depth - 2];
                pos[depth] = pos[depth - 1];
                pp[depth - 2] = p[depth - 2]->sz - 1;
                pos[depth - 1] = p[depth - 2]->pointer[pp[depth - 2]];
                p[depth - 1] = file->read(pos[depth - 1]);
            } else {
                pp[depth] = pp[depth - 2] + 1;
                pos[depth] = p[depth - 2]->pointer[pp[depth]];
                p[depth] = file->read(pos[depth]);
            }
            node *&y = p[depth];
            if (x->sz + y->sz < degree) {
                for (i = 0; i < y->sz; ++i)x->val[x->sz + i] = y->val[i], x->keyvalue[x->sz + i] = y->keyvalue[i];
                x->nxt = y->nxt;
                x->sz += y->sz;
                file->save(pos[depth - 1]);
                file->release(pos[depth]);
                erasenonleaf(depth - 2, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz;
                T tmpv[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                for (i = x->sz; i < newsz; ++i)tmpv[i] = y->val[i - x->sz], tmpk[i] = y->keyvalue[i - x->sz];
                x->sz = newsz + 1 >> 1;
                y->sz = newsz - x->sz;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                for (i = 0; i < y->sz; ++i)y->val[i] = tmpv[i + x->sz], y->keyvalue[i] = tmpk[i + x->sz];
                file->save(pos[depth - 1]);
                file->save(pos[depth]);
                for (i = depth - 2; i >= 0; --i)
                    if (equal(old, p[i]->keyvalue[pp[i]])) {
                        p[i]->keyvalue[pp[i]] = y->keyvalue[0];
                        file->save(pos[i]);
                        break;
                    }
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            --siz;
            return 1;
        }